

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trampoline.cpp
# Opt level: O0

bool __thiscall ChickenHook::Trampoline::install(Trampoline *this,bool doLock)

{
  void *pvVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  reference __src;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> backjump;
  undefined1 local_38 [4];
  int requiredTrampolinSize;
  byte local_19;
  Trampoline *pTStack_18;
  bool doLock_local;
  Trampoline *this_local;
  
  local_19 = doLock;
  pTStack_18 = this;
  if (doLock) {
    lock(this);
    in_XMM0_Qa = extraout_XMM0_Qa;
  }
  log(in_XMM0_Qa);
  printInfo(this);
  bVar2 = updatePermissions(this->_original_addr,7);
  if (bVar2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_original_code,0x40);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_original_code,0);
    memcpy(pvVar3,this->_original_addr,0x40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_real_call_code,0x40);
    generateJump((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                 this->_original_addr,this->_hook_addr);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->_trampoline,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    pvVar1 = this->_original_addr;
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_trampoline);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_real_call_code,0);
    backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = nextInstOff(pvVar1,sVar4,(char *)pvVar3);
    if (backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == -1) {
      log(__x_00);
      this->_real_call_addr = (void *)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_real_call_code);
    }
    else {
      log(__x_00);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->_real_call_code,0);
      memcpy(pvVar3,this->_original_addr,
             (long)backjump.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->_real_call_code,
                          (long)backjump.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      generateJump((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,pvVar3,
                   (void *)((long)this->_original_addr +
                           (long)backjump.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->_real_call_code,
                          (long)backjump.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
      memcpy(pvVar3,__src,sVar4);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->_real_call_code,0);
      bVar2 = updatePermissions(pvVar3,7);
      if (bVar2) {
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->_real_call_code,0);
        this->_real_call_addr = pvVar3;
        log(__x_02);
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                  (&this->_real_call_code,0);
        log(__x_01);
        this->_real_call_addr = (void *)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_real_call_code);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    }
    pvVar1 = this->_original_addr;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_trampoline,0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_trampoline);
    memcpy(pvVar1,pvVar3,sVar4);
    if ((local_19 & 1) != 0) {
      unlock(this);
    }
    this_local._7_1_ = true;
  }
  else {
    log(__x);
    if ((local_19 & 1) != 0) {
      unlock(this);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Trampoline::install(bool doLock) {
        if (doLock) lock();
        log("Install hook at <%p>", _original_addr);
        printInfo();
        if (!updatePermissions(_original_addr, PROT_NONE | PROT_READ | PROT_WRITE | PROT_EXEC)) {
            log("Unable to update permissions <%p>", _original_addr);

            if (doLock) unlock();
            return false;
        }
        // make backup of original code
        _original_code.resize(CODE_SIZE);
        memcpy(&_original_code[0], _original_addr, CODE_SIZE);


        // create real call code
        _real_call_code.resize(CODE_SIZE); // alloc enough space ;)

        // generate jump in order to determine minimum trampoline size
        _trampoline = generateJump(_original_addr, _hook_addr);


        // check function compatibility and required trampoline size (to not destroy greater instructions)
        int requiredTrampolinSize = nextInstOff(_original_addr, _trampoline.size(),
                                                (char *) &_real_call_code[0]);




        if (requiredTrampolinSize == -1) {
            /**
             * Without landing pad, we have to copy the original code, execute it and install hook again.
             */
            log("Unsupported instructions found.. cannot use landing pad. ");
            _real_call_addr = nullptr;
            _real_call_code.clear();
        } else {
            /**
             * Our hook can call the landing pad instead of the original function in order to execute the original code.
             */
            log("Required trampoline size <%d>", requiredTrampolinSize);


            // copy original code of trampoline size and add trampoline to jump back
            memcpy(&_real_call_code[0], _original_addr, requiredTrampolinSize);
            std::vector<uint8_t> backjump = generateJump(
                    (void *) &_real_call_code[requiredTrampolinSize],
                    (void *) (((char *) _original_addr + (requiredTrampolinSize))));
            memcpy(&_real_call_code[requiredTrampolinSize], &backjump[0], backjump.size());

            // make real call code executable
            if (!updatePermissions(&_real_call_code[0], PROT_READ | PROT_WRITE | PROT_EXEC)) {
                log("Unable to update permissions of landing pad <%p>", &_real_call_code[0]);

                _real_call_addr = nullptr;
                _real_call_code.clear();
            } else {
                _real_call_addr = &_real_call_code[0];
                log("Created landing pad at <%p>", _real_call_addr);
            }
        }

        // insert jump to hooking function
        memcpy(_original_addr, &_trampoline[0], _trampoline.size());


        /*if (!updatePermissions(_original_addr, PROT_READ | PROT_EXEC)) {
            if (doLock) unlock();
            return true; // this doesn't break our use-case
        }*/


        if (doLock) unlock();
        return true;
    }